

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_raster.cpp
# Opt level: O0

int gray_conic_to(SW_FT_Vector *control,SW_FT_Vector *to,gray_PWorker worker)

{
  SW_FT_Vector *in_stack_00000030;
  SW_FT_Vector *in_stack_00000038;
  gray_PWorker in_stack_00000040;
  
  gray_render_conic(in_stack_00000040,in_stack_00000038,in_stack_00000030);
  return 0;
}

Assistant:

static int gray_conic_to(const SW_FT_Vector* control, const SW_FT_Vector* to,
                         gray_PWorker worker)
{
    gray_render_conic(RAS_VAR_ control, to);
    return 0;
}